

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

void __thiscall lwlog::details::pattern::request_flag_formatters(pattern *this)

{
  const_iterator cVar1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  pointer pbVar2;
  basic_string_view<char,_std::char_traits<char>_> flag;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_78;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  key_type local_48;
  
  parse_verbose_flags(&local_60,this);
  parse_short_flags(&local_78,this);
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_60.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_48._M_len = pbVar2->_M_len;
      local_48._M_str = pbVar2->_M_str;
      cVar1 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)verbose_data,&local_48);
      if (cVar1.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::
        vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
        ::push_back(&this->m_formatters,
                    (value_type *)
                    ((long)cVar1.
                           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
                           ._M_cur + 0x18));
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_60.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_78.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_48._M_len = pbVar2->_M_len;
      local_48._M_str = pbVar2->_M_str;
      cVar1 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)shortened_data,&local_48);
      if (cVar1.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::
        vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
        ::push_back(&this->m_formatters,
                    (value_type *)
                    ((long)cVar1.
                           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
                           ._M_cur + 0x18));
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_78.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pattern::request_flag_formatters()
	{
		const auto& verbose_flags{ this->parse_verbose_flags() };
		const auto& short_flags{ this->parse_short_flags() };

		for (const auto flag : verbose_flags)
		{
			if (const auto it{ verbose_data.find(flag) }; 
				it != verbose_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}

		for (const auto flag : short_flags)
		{
			if (const auto it{ shortened_data.find(flag) }; 
				it != shortened_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}
	}